

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_button_text(nk_command_buffer *out,nk_rect *bounds,nk_rect *content,nk_flags state,
                        nk_style_button *style,char *txt,int len,nk_flags text_alignment,
                        nk_user_font *font)

{
  nk_style_item *pnVar1;
  nk_style_item *background;
  nk_text text;
  char *txt_local;
  nk_style_button *style_local;
  nk_flags state_local;
  nk_rect *content_local;
  nk_rect *bounds_local;
  nk_command_buffer *out_local;
  
  text._8_8_ = txt;
  pnVar1 = nk_draw_button(out,bounds,state,style);
  if (pnVar1->type == NK_STYLE_ITEM_COLOR) {
    text.padding.x = *(float *)&(pnVar1->data).color;
  }
  else {
    text.padding.x = *(float *)&style->text_background;
  }
  if ((state & 0x10) == 0) {
    if ((state & 0x20) == 0) {
      text.padding.y = *(float *)&style->text_normal;
    }
    else {
      text.padding.y = *(float *)&style->text_active;
    }
  }
  else {
    text.padding.y = *(float *)&style->text_hover;
  }
  background = (nk_style_item *)nk_vec2(0.0,0.0);
  nk_widget_text(out,*content,(char *)text._8_8_,len,(nk_text *)&background,text_alignment,font);
  return;
}

Assistant:

NK_LIB void
nk_draw_button_text(struct nk_command_buffer *out,
    const struct nk_rect *bounds, const struct nk_rect *content, nk_flags state,
    const struct nk_style_button *style, const char *txt, int len,
    nk_flags text_alignment, const struct nk_user_font *font)
{
    struct nk_text text;
    const struct nk_style_item *background;
    background = nk_draw_button(out, bounds, state, style);

    /* select correct colors/images */
    if (background->type == NK_STYLE_ITEM_COLOR)
        text.background = background->data.color;
    else text.background = style->text_background;
    if (state & NK_WIDGET_STATE_HOVER)
        text.text = style->text_hover;
    else if (state & NK_WIDGET_STATE_ACTIVED)
        text.text = style->text_active;
    else text.text = style->text_normal;

    text.padding = nk_vec2(0,0);
    nk_widget_text(out, *content, txt, len, &text, text_alignment, font);
}